

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O1

void av1_single_motion_search
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int ref_idx,int *rate_mv,
               int search_range,inter_mode_info *mode_info,int_mv *best_mv,HandleInterModeArgs *args
               )

{
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  MV start_mv;
  undefined8 *puVar1;
  char cVar2;
  byte bVar3;
  BLOCK_SIZE BVar4;
  short sVar5;
  short sVar6;
  int mi_col;
  FULLPEL_MV FVar7;
  int iVar8;
  MB_MODE_INFO *pMVar9;
  ushort uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  MV *pMVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  short sVar20;
  uint uVar21;
  int *cost_list_00;
  search_site_config *psVar22;
  ulong uVar23;
  buf_2d *pbVar24;
  inter_mode_info *piVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  byte bVar30;
  short sVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  size_t sVar35;
  long lVar36;
  size_t __nmemb;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  bool bVar41;
  MV ref_mv;
  FULLPEL_MV local_574;
  uint local_558;
  MV this_best_mv_1;
  int dis;
  MACROBLOCKD *local_518;
  ulong local_510;
  ulong local_508;
  MvCosts *local_500;
  ulong local_4f8;
  search_site_config *local_4f0;
  int local_4e8;
  uint sse;
  ulong local_4e0;
  ulong local_4d8;
  uint local_4cc;
  long local_4c8;
  YV12_BUFFER_CONFIG *local_4c0;
  FULLPEL_MV_STATS best_mv_stats;
  int_mv fractional_ms_list [3];
  FULLPEL_MV this_best_mv;
  FULLPEL_MV this_second_best_mv;
  int iStack_46c;
  int cost_list [5];
  buf_2d backup_yv12 [3];
  FULLPEL_MV_STATS this_mv_stats;
  int local_3a8;
  int local_3a4;
  int local_3a0;
  int local_39c;
  cand_mv_t cand [65];
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  
  xd = &x->e_mbd;
  bVar41 = ((cpi->common).seq_params)->monochrome == '\0';
  uVar37 = bVar41 + 1 + (uint)bVar41;
  uVar23 = (ulong)uVar37;
  pMVar9 = *(x->e_mbd).mi;
  backup_yv12[2].width = 0;
  backup_yv12[2].height = 0;
  backup_yv12[2].stride = 0;
  backup_yv12[2]._28_4_ = 0;
  backup_yv12[2].buf = (uint8_t *)0x0;
  backup_yv12[2].buf0 = (uint8_t *)0x0;
  backup_yv12[1].width = 0;
  backup_yv12[1].height = 0;
  backup_yv12[1].stride = 0;
  backup_yv12[1]._28_4_ = 0;
  backup_yv12[1].buf = (uint8_t *)0x0;
  backup_yv12[1].buf0 = (uint8_t *)0x0;
  backup_yv12[0].width = 0;
  backup_yv12[0].height = 0;
  backup_yv12[0].stride = 0;
  backup_yv12[0]._28_4_ = 0;
  backup_yv12[0].buf = (uint8_t *)0x0;
  backup_yv12[0].buf0 = (uint8_t *)0x0;
  local_4c8 = (long)ref_idx;
  cVar2 = pMVar9->ref_frame[local_4c8];
  local_4c0 = av1_get_scaled_ref_frame(cpi,(int)cVar2);
  iVar17 = (x->e_mbd).mi_row;
  mi_col = (x->e_mbd).mi_col;
  local_500 = x->mv_costs;
  if (local_4c0 != (YV12_BUFFER_CONFIG *)0x0) {
    pbVar24 = backup_yv12;
    lVar29 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[local_4c8].buf + lVar29);
      puVar11 = (uint8_t *)*puVar1;
      puVar12 = (uint8_t *)puVar1[1];
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[local_4c8].width + lVar29);
      uVar13 = *puVar1;
      uVar14 = puVar1[1];
      pbVar24->width = (int)uVar13;
      pbVar24->height = (int)((ulong)uVar13 >> 0x20);
      *(undefined8 *)&pbVar24->stride = uVar14;
      pbVar24->buf = puVar11;
      pbVar24->buf0 = puVar12;
      pbVar24 = pbVar24 + 1;
      lVar29 = lVar29 + 0xa30;
    } while (uVar23 * 0xa30 - lVar29 != 0);
    av1_setup_pre_planes(xd,ref_idx,local_4c0,iVar17,mi_col,(scale_factors *)0x0,uVar37);
  }
  uVar34 = (ulong)(int)cVar2;
  local_518 = xd;
  local_4e8 = iVar17;
  local_4e0 = uVar23;
  if (((cpi->sf).mv_sf.auto_mv_step_size == 0) || ((cpi->common).show_frame == 0)) {
    uVar37 = (cpi->mv_search_params).mv_step_param;
  }
  else {
    iVar17 = av1_init_search_range(x->max_mv_context[uVar34]);
    uVar37 = (iVar17 + (cpi->mv_search_params).mv_step_param) / 2;
  }
  local_508 = (ulong)uVar37;
  ref_mv = (MV)av1_get_ref_mv(x,ref_idx);
  if (pMVar9->motion_mode == '\0') {
    pMVar16 = &ref_mv;
    iVar17 = (int)ref_mv.row - (~(int)ref_mv.row >> 0x1f);
  }
  else {
    uVar37 = (uint)pMVar9->mv[0].as_mv.row;
    iVar17 = uVar37 - ((int)~uVar37 >> 0x1f);
    pMVar16 = (MV *)pMVar9->mv;
  }
  uVar37 = iVar17 + 3U >> 3 & 0xffff |
           ((int)pMVar16->col - (~(int)pMVar16->col >> 0x1f)) * 0x2000 + 0x6000U & 0xffff0000;
  local_4f8 = 0;
  memset(cand,0,0x208);
  local_4d8 = CONCAT44(local_4d8._4_4_,uVar37);
  cand[0].fmv.as_int = uVar37;
  __nmemb = 1;
  uVar37 = 1;
  if ((((cpi->sf).mv_sf.full_pixel_search_level == 0) && (pMVar9->motion_mode == '\0')) &&
     ((x->sb_enc).tpl_data_count != 0)) {
    bVar3 = (cpi->ppi->tpl_data).tpl_bsize_1d;
    if (bVar3 < 0x10) {
      if (bVar3 == 4) {
        lVar29 = 0;
      }
      else {
        if (bVar3 != 8) goto LAB_003bf1cc;
        lVar29 = 3;
      }
    }
    else if (bVar3 == 0x10) {
LAB_003bf1cc:
      lVar29 = 6;
    }
    else {
      lVar29 = 0xc;
      if (bVar3 != 0x40) {
        if (bVar3 != 0x20) goto LAB_003bf1cc;
        lVar29 = 9;
      }
    }
    bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[lVar29];
    bVar30 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[lVar29];
    if (bVar30 <= "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [bsize] &&
        bVar3 <= "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize]
       ) {
      BVar4 = ((cpi->common).seq_params)->sb_size;
      uVar23 = (long)(x->e_mbd).mi_row %
               (long)(int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [BVar4];
      uVar32 = (long)(x->e_mbd).mi_col %
               (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [BVar4];
      uVar23 = (long)((ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff) /
               (long)(int)(uint)bVar30;
      local_510 = uVar23 & 0xffffffff;
      iVar17 = (x->sb_enc).tpl_stride;
      local_4cc = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [bsize] / bVar30);
      uVar39 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [bsize] / bVar3);
      uVar40 = local_4cc * uVar39;
      local_4f8 = (ulong)uVar40;
      cand[0].weight = uVar40;
      psVar22 = (search_site_config *)0x0;
      bVar41 = true;
      do {
        local_4f0 = psVar22;
        uVar27 = 0;
        bVar15 = true;
        do {
          lVar29 = (long)(((int)psVar22 + (int)uVar23) * iVar17 +
                          (int)((long)((ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 |
                                      uVar32 & 0xffffffff) / (long)(int)(uint)bVar3) + (int)uVar27);
          sVar5 = (x->sb_enc).tpl_mv[lVar29 + -1][uVar34 + 6].as_mv.row;
          sVar6 = *(short *)((long)(x->sb_enc).tpl_mv[lVar29 + -1] + uVar34 * 4 + 0x1a);
          if (CONCAT22(sVar6,sVar5) == -0x7fff8000) {
            bVar15 = false;
          }
          else {
            iVar19 = (int)__nmemb;
            sVar31 = (short)((uint)(-1 < sVar5) + (int)sVar5 + 3 >> 3);
            sVar20 = (short)((uint)(-1 < sVar6) + (int)sVar6 + 3 >> 3);
            if (0 < iVar19) {
              sVar35 = 0;
              do {
                uVar37 = (uint)cand[sVar35].fmv.as_mv.row;
                if ((((uVar37 - ((int)~uVar37 >> 0x1f)) + 3 ^
                     ((int)sVar31 - (~(int)sVar31 >> 0x1f)) + 3U) < 8) &&
                   (uVar37 = (uint)cand[sVar35].fmv.as_mv.col,
                   ((uVar37 - ((int)~uVar37 >> 0x1f)) + 3 ^
                   ((int)sVar20 - (~(int)sVar20 >> 0x1f)) + 3U) < 8)) {
                  cand[sVar35].weight = cand[sVar35].weight + 1;
                  goto LAB_003bf406;
                }
                sVar35 = sVar35 + 1;
              } while (__nmemb != sVar35);
            }
            cand[iVar19].fmv.as_mv.row = sVar31;
            cand[iVar19].fmv.as_mv.col = sVar20;
            cand[iVar19].weight = 1;
            __nmemb = (size_t)(iVar19 + 1);
          }
LAB_003bf406:
          uVar37 = (uint)__nmemb;
        } while ((CONCAT22(sVar6,sVar5) != -0x7fff8000) && (uVar27 = uVar27 + 1, uVar27 < uVar39));
        if (!bVar15) {
          if (bVar41) {
            local_4f8 = 0;
            goto LAB_003bf4a0;
          }
          break;
        }
        uVar21 = (int)psVar22 + 1;
        psVar22 = (search_site_config *)(ulong)uVar21;
        bVar41 = uVar21 < local_4cc;
      } while (bVar41);
      local_4f8 = (ulong)(uVar40 * 2);
      if (2 < (int)uVar37) {
        qsort(cand,__nmemb,8,compare_weight);
      }
LAB_003bf4a0:
    }
  }
  uVar40 = 2;
  if ((int)uVar37 < 2) {
    uVar40 = uVar37;
  }
  local_510 = CONCAT44(local_510._4_4_,uVar40);
  if ((((cpi->sf).mv_sf.skip_fullpel_search_using_startmv != 0) && (pMVar9->motion_mode == '\0')) &&
     (0 < (int)uVar37)) {
    uVar39 = args->start_mv_cnt;
    uVar23 = 0;
    do {
      if ((int)uVar39 < 1) {
LAB_003beb55:
        if ((*(ushort *)&pMVar9->field_0xa7 & 0x30) != 0x20) {
          *(int_mv *)(args->start_mv_stack + args->start_mv_cnt) = cand[uVar23].fmv;
          args->ref_mv_idx_stack[args->start_mv_cnt] = (byte)pMVar9->field_0xa7 >> 4 & 3;
          args->start_mv_cnt = args->start_mv_cnt + 1;
        }
      }
      else {
        uVar32 = 0;
        bVar41 = false;
        do {
          uVar26 = (int)args->start_mv_stack[uVar32].row - (int)cand[uVar23].fmv.as_mv.row;
          uVar21 = -uVar26;
          if (0 < (int)uVar26) {
            uVar21 = uVar26;
          }
          uVar38 = (int)args->start_mv_stack[uVar32].col - (int)cand[uVar23].fmv.as_mv.col;
          uVar26 = -uVar38;
          if (0 < (int)uVar38) {
            uVar26 = uVar38;
          }
          if (args->single_newmv_valid[args->ref_mv_idx_stack[uVar32]][uVar34] == 0) {
            iVar17 = 10;
          }
          else {
            iVar17 = (cpi->sf).mv_sf.skip_fullpel_search_using_startmv;
            if (iVar17 < 2) {
              if (iVar17 == 1) {
                uVar26 = uVar26 + uVar21;
                goto LAB_003beb09;
              }
            }
            else if (uVar21 < 2) {
LAB_003beb09:
              if (uVar26 < 2) {
                iVar17 = 8;
                bVar41 = true;
                goto LAB_003beb1f;
              }
            }
            iVar17 = 0;
          }
LAB_003beb1f:
        } while (((iVar17 == 10) || (iVar17 == 0)) && (uVar32 = uVar32 + 1, uVar39 != uVar32));
        if (!bVar41) goto LAB_003beb55;
        cand[uVar23].fmv.as_int = 0x80008000;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar40);
  }
  bVar30 = (cpi->sf).mv_sf.search_method;
  iVar17 = (cpi->sf).mv_sf.use_bsize_dependent_search_method;
  bVar3 = block_size_high[bsize];
  if (block_size_wide[bsize] < block_size_high[bsize]) {
    bVar3 = block_size_wide[bsize];
  }
  if ((iVar17 == 1 && 0x1f < bVar3) ||
     (((0xf < bVar3 && 1 < iVar17 && ((x->content_state_sb).source_sad_nonrd < kHighSad)) &&
      (x->qindex < 0xc0)))) {
    if (bVar30 < 0xb) {
      bVar30 = (&DAT_00561380)[bVar30];
    }
    else {
      bVar30 = 0;
    }
  }
  iVar17 = (x->e_mbd).plane[0].pre[0].stride;
  if (iVar17 == (cpi->mv_search_params).search_site_cfg[0][0].stride) {
    psVar22 = (cpi->mv_search_params).search_site_cfg[0];
  }
  else if (iVar17 == (cpi->mv_search_params).search_site_cfg[1][0].stride) {
    psVar22 = (cpi->mv_search_params).search_site_cfg[1];
  }
  else {
    psVar22 = x->search_site_cfg_buf;
    if (iVar17 != x->search_site_cfg_buf[""[bVar30]].stride) {
      local_4f0 = psVar22;
      (*av1_init_motion_compensation[""[""[bVar30]]])
                (psVar22 + ""[""[bVar30]],iVar17,SUB14((bVar30 & 0xfe) == 2,0));
      psVar22 = local_4f0;
    }
  }
  uVar40 = (uint)local_508;
  if (search_range != 0x7fffffff) {
    bVar3 = ""[bVar30];
    if (search_range < 1) {
      uVar40 = psVar22[bVar3].num_search_steps;
    }
    else {
      uVar39 = ~uVar40;
      uVar40 = uVar40 - 1;
      iVar17 = uVar39 + psVar22[bVar3].num_search_steps;
      do {
        uVar40 = uVar40 + 1;
        iVar19 = psVar22[bVar3].radius[iVar17];
        if (iVar19 == search_range * 2 ||
            SBORROW4(iVar19,search_range * 2) != iVar19 + search_range * -2 < 0) break;
        bVar41 = 0 < iVar17;
        iVar17 = iVar17 + -1;
      } while (bVar41);
    }
  }
  best_mv->as_int = 0x80008000;
  local_558 = 0;
  if ((cpi->is_screen_content_type != 0) &&
     ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] == '\x03')) {
    local_558 = (uint)((cpi->oxcf).speed < 3);
  }
  uVar39 = 0x8000;
  local_508 = uVar34;
  if (pMVar9->motion_mode == '\x01') {
    FVar7 = local_4d8._0_4_;
    av1_make_default_fullpel_ms_params
              (&full_ms_params,cpi,x,bsize,&ref_mv,local_4d8._0_4_,psVar22,bVar30,local_558);
    iVar17 = av1_obmc_full_pixel_search(FVar7,&full_ms_params,uVar40,&best_mv->as_fullmv);
LAB_003bef8e:
    local_574.row = -0x8000;
    local_574.col = 0;
    uVar21 = (uint)local_4e0;
  }
  else {
    iVar17 = 0x7fffffff;
    if (pMVar9->motion_mode != '\0') goto LAB_003bef8e;
    local_574.row = -0x8000;
    local_574.col = 0;
    uVar21 = (uint)local_4e0;
    if (0 < (int)uVar37) {
      iVar19 = (int)local_4f8;
      uVar32 = local_510 & 0xffffffff;
      local_574.row = -0x8000;
      local_574.col = 0;
      uVar27 = 0;
      local_4d8 = (ulong)bVar30;
      iVar28 = 0;
      uVar39 = 0x8000;
      local_4f0 = psVar22;
      local_510 = uVar32;
      uVar23 = local_4e0;
      do {
        FVar7 = cand[uVar27].fmv.as_fullmv;
        lVar29 = 0;
        if (FVar7 != (FULLPEL_MV)0x80008000) {
          av1_make_default_fullpel_ms_params
                    (&full_ms_params,cpi,x,bsize,&ref_mv,FVar7,psVar22,(SEARCH_METHODS)local_4d8,
                     local_558);
          if (((cpi->sf).mv_sf.subpel_search_method == '\0') ||
             ((cpi->sf).mv_sf.use_fullpel_costlist == 0)) {
            cost_list_00 = (int *)0x0;
          }
          else {
            cost_list_00 = cost_list;
          }
          iVar18 = av1_full_pixel_search
                             (FVar7,&full_ms_params,uVar40,cost_list_00,&this_best_mv,&this_mv_stats
                              ,&this_second_best_mv);
          if (iVar18 < iVar17) {
            best_mv->as_fullmv = this_best_mv;
            best_mv_stats.sse = this_mv_stats.sse;
            local_574 = this_second_best_mv;
            uVar39 = (uint)this_second_best_mv >> 0x10;
            iVar17 = iVar18;
          }
          iVar28 = iVar28 + cand[uVar27].weight;
          lVar29 = 0xe;
          uVar23 = local_4e0;
          uVar32 = local_510;
          psVar22 = local_4f0;
          uVar34 = local_508;
          if (iVar28 * 4 <= iVar19 * 3) {
            lVar29 = 0;
          }
        }
        uVar21 = (uint)uVar23;
      } while ((lVar29 == 0) && (uVar27 = uVar27 + 1, uVar32 != uVar27));
    }
  }
  if (best_mv->as_int == 0x80008000) {
    return;
  }
  if (local_4c0 != (YV12_BUFFER_CONFIG *)0x0) {
    pbVar24 = backup_yv12;
    lVar29 = 0;
    do {
      puVar11 = pbVar24->buf;
      puVar12 = pbVar24->buf0;
      uVar13 = *(undefined8 *)&pbVar24->stride;
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[local_4c8].width + lVar29);
      *puVar1 = *(undefined8 *)&pbVar24->width;
      puVar1[1] = uVar13;
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[local_4c8].buf + lVar29);
      *puVar1 = puVar11;
      puVar1[1] = puVar12;
      pbVar24 = pbVar24 + 1;
      lVar29 = lVar29 + 0xa30;
    } while ((ulong)uVar21 * 0xa30 - lVar29 != 0);
  }
  if (((1 < (cpi->sf).inter_sf.skip_newmv_in_drl) && (pMVar9->motion_mode == '\0')) &&
     (best_mv->as_int != 0x80008000)) {
    this_mv_stats.err_cost =
         (uint)(ushort)(best_mv->as_mv).col * 0x80000 + ((ushort)(best_mv->as_mv).row & 0x1fff) * 8;
    uVar10 = *(ushort *)&pMVar9->field_0xa7 >> 4;
    uVar37 = uVar10 & 3;
    iVar19 = av1_mv_bit_cost((MV *)&this_mv_stats,&ref_mv,local_500->nmv_joint_cost,
                             local_500->mv_cost_stack,0x6c);
    mode_info[uVar37].full_search_mv.as_int = this_mv_stats.err_cost;
    mode_info[uVar37].full_mv_rate = iVar19;
    mode_info[uVar37].full_mv_bestsme = iVar17;
    if ((uVar10 & 3) == 0) {
      iVar28 = 0x14;
    }
    else {
      piVar25 = mode_info + uVar37;
      lVar29 = 0;
      do {
        if ((this_mv_stats.err_cost == *(int *)((long)&mode_info->full_search_mv + lVar29)) &&
           (*(int *)((long)&mode_info->drl_cost + lVar29) +
            *(int *)((long)&mode_info->full_mv_rate + lVar29) <= piVar25->drl_cost + iVar19)) {
          best_mv->as_int = 0x80008000;
          iVar28 = 1;
          goto LAB_003bf4c3;
        }
        iVar18 = *(int *)((long)&mode_info->full_mv_bestsme + lVar29);
        iVar28 = 0x16;
        if (iVar18 != 0x7fffffff) {
          iVar8 = (cpi->sf).inter_sf.skip_newmv_in_drl;
          iVar28 = 0;
          if (2 < iVar8) {
            iVar33 = iVar18 >> 2;
            iVar28 = 0;
            if (iVar8 != 3) {
              iVar33 = 0;
            }
            if ((iVar33 + iVar18 < piVar25->full_mv_bestsme) &&
               (*(int *)((long)&mode_info->drl_cost + lVar29) < piVar25->drl_cost)) {
              best_mv->as_int = 0x80008000;
              iVar28 = 1;
            }
          }
        }
        if ((iVar28 != 0x16) && (iVar28 != 0)) goto LAB_003bf4c3;
        lVar29 = lVar29 + 0x14;
      } while ((ulong)(uVar37 << 2) * 5 != lVar29);
      iVar28 = 0x14;
    }
LAB_003bf4c3:
    uVar34 = local_508;
    if ((iVar28 != 0x14) && (iVar28 != 0)) {
      return;
    }
  }
  if ((cpi->common).features.cur_frame_force_integer_mv == true) {
    best_mv->as_int =
         (uint)(ushort)(best_mv->as_mv).col * 0x80000 + ((ushort)(best_mv->as_mv).row & 0x1fff) * 8;
  }
  bVar41 = true;
  iVar19 = 0;
  if ((iVar17 == 0x7fffffff) ||
     (iVar19 = 0, (cpi->common).features.cur_frame_force_integer_mv != false)) goto LAB_003bf515;
  cm = &cpi->common;
  fractional_ms_list[0] = (int_mv)0x80008000;
  fractional_ms_list[1] = (int_mv)0x80008000;
  fractional_ms_list[2].as_int = 0x80008000;
  av1_make_default_subpel_ms_params
            ((SUBPEL_MOTION_SEARCH_PARAMS *)&this_mv_stats,cpi,x,bsize,&ref_mv,cost_list);
  start_mv = (MV)((uint)(ushort)(best_mv->as_mv).col * 0x80000 +
                 ((ushort)(best_mv->as_mv).row & 0x1fff) * 8);
  if (pMVar9->motion_mode == '\x01') {
    av1_find_best_obmc_sub_pixel_tree_up
              (local_518,cm,(SUBPEL_MOTION_SEARCH_PARAMS *)&this_mv_stats,start_mv,
               (FULLPEL_MV_STATS *)0x0,&best_mv->as_mv,&dis,x->pred_sse + uVar34,(int_mv *)0x0);
  }
  else if (pMVar9->motion_mode == '\0') {
    if ((cpi->sf).mv_sf.use_accurate_subpel_search == '\0') {
      (*(cpi->mv_search_params).find_fractional_mv_step)
                (local_518,cm,(SUBPEL_MOTION_SEARCH_PARAMS *)&this_mv_stats,start_mv,&best_mv_stats,
                 (MV *)best_mv,&dis,x->pred_sse + uVar34,(int_mv *)0x0);
    }
    else {
      uVar37 = (uint)local_574 & 0xffff | uVar39 << 0x10;
      if ((uVar37 == 0x80008000) || (uVar37 == best_mv->as_int)) {
        bVar41 = false;
      }
      else {
        bVar41 = (cpi->sf).mv_sf.disable_second_mv < 2;
      }
      iVar17 = (*(cpi->mv_search_params).find_fractional_mv_step)
                         (local_518,cm,(SUBPEL_MOTION_SEARCH_PARAMS *)&this_mv_stats,start_mv,
                          &best_mv_stats,(MV *)best_mv,&dis,x->pred_sse + uVar34,fractional_ms_list)
      ;
      if (bVar41) {
        lVar29 = 0x7fffffffffffffff;
        _this_best_mv = (x->e_mbd).plane[0].dst.buf;
        if ((cpi->sf).mv_sf.disable_second_mv == 0) {
          pMVar9->mv[0] = *best_mv;
          av1_enc_build_inter_predictor
                    (cm,local_518,local_4e8,mi_col,(BUFFER_SET *)&this_best_mv,bsize,0,0);
          av1_subtract_plane(x,bsize,0);
          this_second_best_mv.row = 0;
          this_second_best_mv.col = 0;
          iStack_46c = 0;
          av1_estimate_txfm_yrd
                    (cpi,x,(RD_STATS *)&this_second_best_mv,0x7fffffffffffffff,bsize,""[bsize]);
          iVar19 = av1_mv_bit_cost(&best_mv->as_mv,&ref_mv,local_500->nmv_joint_cost,
                                   local_500->mv_cost_stack,0x6c);
          lVar29 = (long)x->rdmult * ((long)iVar19 + (long)(int)this_second_best_mv) + 0x100 >> 9;
        }
        iVar19 = (int)(short)((short)uVar39 * 8);
        if ((local_3a8 <= iVar19) && (iVar19 <= local_3a4)) {
          iVar19 = (int)(short)((int)local_574 << 3);
          if ((local_3a0 <= iVar19) && (iVar19 <= local_39c)) {
            iVar19 = (*(cpi->mv_search_params).find_fractional_mv_step)
                               (local_518,cm,(SUBPEL_MOTION_SEARCH_PARAMS *)&this_mv_stats,
                                (MV)((int)local_574 << 3 & 0xffffU | uVar39 << 0x13),
                                (FULLPEL_MV_STATS *)0x0,&this_best_mv_1,&dis,&sse,fractional_ms_list
                               );
            if ((cpi->sf).mv_sf.disable_second_mv == 0) {
              pMVar9->mv[0].as_mv = this_best_mv_1;
              av1_enc_build_inter_predictor
                        (cm,local_518,local_4e8,mi_col,(BUFFER_SET *)&this_best_mv,bsize,0,0);
              av1_subtract_plane(x,bsize,0);
              this_second_best_mv.row = 0;
              this_second_best_mv.col = 0;
              iStack_46c = 0;
              av1_estimate_txfm_yrd
                        (cpi,x,(RD_STATS *)&this_second_best_mv,0x7fffffffffffffff,bsize,""[bsize]);
              iVar17 = av1_mv_bit_cost(&this_best_mv_1,&ref_mv,local_500->nmv_joint_cost,
                                       local_500->mv_cost_stack,0x6c);
              if ((long)x->rdmult * ((long)iVar17 + (long)(int)this_second_best_mv) + 0x100 >> 9 <
                  lVar29) goto LAB_003bfa11;
            }
            else if (iVar19 < iVar17) {
LAB_003bfa11:
              best_mv->as_mv = this_best_mv_1;
              x->pred_sse[uVar34] = sse;
            }
          }
        }
      }
    }
  }
  iVar19 = 0;
  bVar41 = true;
  if ((((args != (HandleInterModeArgs *)0x0) && (0 < (cpi->sf).inter_sf.skip_newmv_in_drl)) &&
      (pMVar9->motion_mode == '\0')) && (best_mv->as_int != 0x80008000)) {
    uVar10 = *(ushort *)&pMVar9->field_0xa7 >> 4;
    uVar37 = uVar10 & 3;
    iVar19 = av1_mv_bit_cost(&best_mv->as_mv,&ref_mv,local_500->nmv_joint_cost,
                             local_500->mv_cost_stack,0x6c);
    if ((uVar10 & 3) != 0) {
      piVar25 = mode_info + uVar37;
      lVar36 = uVar34 << 2;
      lVar29 = 0;
      do {
        if ((*(int *)((long)*args->single_newmv_valid + lVar36) != 0) &&
           (best_mv->as_int == *(uint32_t *)((long)*args->single_newmv + lVar36))) {
          if (*(int *)((long)&mode_info->skip + lVar29) == 0) {
            if (piVar25->drl_cost + iVar19 <
                *(int *)((long)&mode_info->drl_cost + lVar29) +
                *(int *)((long)*args->single_newmv_rate + lVar36)) goto LAB_003bf771;
          }
          else {
            piVar25 = mode_info + (ushort)uVar37;
          }
          piVar25->skip = 1;
          break;
        }
LAB_003bf771:
        lVar29 = lVar29 + 0x14;
        lVar36 = lVar36 + 0x20;
      } while ((ulong)(uVar37 * 4) * 5 != lVar29);
    }
    bVar41 = false;
  }
LAB_003bf515:
  if (bVar41) {
    iVar19 = av1_mv_bit_cost(&best_mv->as_mv,&ref_mv,local_500->nmv_joint_cost,
                             local_500->mv_cost_stack,0x6c);
  }
  *rate_mv = iVar19;
  return;
}

Assistant:

void av1_single_motion_search(const AV1_COMP *const cpi, MACROBLOCK *x,
                              BLOCK_SIZE bsize, int ref_idx, int *rate_mv,
                              int search_range, inter_mode_info *mode_info,
                              int_mv *best_mv,
                              struct HandleInterModeArgs *const args) {
  MACROBLOCKD *xd = &x->e_mbd;
  const AV1_COMMON *cm = &cpi->common;
  const MotionVectorSearchParams *mv_search_params = &cpi->mv_search_params;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];
  struct buf_2d backup_yv12[MAX_MB_PLANE] = { { 0, 0, 0, 0, 0 } };
  int bestsme = INT_MAX;
  const int ref = mbmi->ref_frame[ref_idx];
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const MvCosts *mv_costs = x->mv_costs;

  if (scaled_ref_frame) {
    // Swap out the reference frame for a version that's been scaled to
    // match the resolution of the current frame, allowing the existing
    // full-pixel motion search code to be used without additional
    // modifications.
    for (int i = 0; i < num_planes; i++) {
      backup_yv12[i] = xd->plane[i].pre[ref_idx];
    }
    av1_setup_pre_planes(xd, ref_idx, scaled_ref_frame, mi_row, mi_col, NULL,
                         num_planes);
  }

  // Work out the size of the first step in the mv step search.
  // 0 here is maximum length first step. 1 is AOMMAX >> 1 etc.
  int step_param;
  if (cpi->sf.mv_sf.auto_mv_step_size && cm->show_frame) {
    // Take the weighted average of the step_params based on the last frame's
    // max mv magnitude and that based on the best ref mvs of the current
    // block for the given reference.
    step_param = (av1_init_search_range(x->max_mv_context[ref]) +
                  mv_search_params->mv_step_param) /
                 2;
  } else {
    step_param = mv_search_params->mv_step_param;
  }

  const MV ref_mv = av1_get_ref_mv(x, ref_idx).as_mv;
  FULLPEL_MV start_mv;
  if (mbmi->motion_mode != SIMPLE_TRANSLATION)
    start_mv = get_fullmv_from_mv(&mbmi->mv[0].as_mv);
  else
    start_mv = get_fullmv_from_mv(&ref_mv);

  // cand stores start_mv and all possible MVs in a SB.
  cand_mv_t cand[MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB + 1];
  av1_zero(cand);
  cand[0].fmv.as_fullmv = start_mv;
  int cnt = 1;
  int total_weight = 0;

  if (!cpi->sf.mv_sf.full_pixel_search_level &&
      mbmi->motion_mode == SIMPLE_TRANSLATION) {
    get_mv_candidate_from_tpl(cpi, x, bsize, ref, cand, &cnt, &total_weight);
  }

  const int cand_cnt = AOMMIN(2, cnt);
  // TODO(any): Test the speed feature for OBMC_CAUSAL mode.
  if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv &&
      mbmi->motion_mode == SIMPLE_TRANSLATION) {
    const int stack_size = args->start_mv_cnt;
    for (int cand_idx = 0; cand_idx < cand_cnt; cand_idx++) {
      int_mv *fmv_cand = &cand[cand_idx].fmv;
      int skip_cand_mv = 0;

      // Check difference between mvs in the stack and candidate mv.
      for (int stack_idx = 0; stack_idx < stack_size; stack_idx++) {
        const uint8_t this_ref_mv_idx = args->ref_mv_idx_stack[stack_idx];
        const FULLPEL_MV *fmv_stack = &args->start_mv_stack[stack_idx];
        const int this_newmv_valid =
            args->single_newmv_valid[this_ref_mv_idx][ref];
        const int row_diff = abs(fmv_stack->row - fmv_cand->as_fullmv.row);
        const int col_diff = abs(fmv_stack->col - fmv_cand->as_fullmv.col);

        if (!this_newmv_valid) continue;

        if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv >= 2) {
          // Prunes the current start_mv candidate, if the absolute mv
          // difference of both row and column are <= 1.
          if (row_diff <= 1 && col_diff <= 1) {
            skip_cand_mv = 1;
            break;
          }
        } else if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv >= 1) {
          // Prunes the current start_mv candidate, if the sum of the absolute
          // mv difference of row and column is <= 1.
          if (row_diff + col_diff <= 1) {
            skip_cand_mv = 1;
            break;
          }
        }
      }
      if (skip_cand_mv) {
        // Ensure atleast one full-pel motion search is not pruned.
        assert(mbmi->ref_mv_idx != 0);
        // Mark the candidate mv as invalid so that motion search gets skipped.
        cand[cand_idx].fmv.as_int = INVALID_MV;
      } else {
        // Store start_mv candidate and corresponding ref_mv_idx of full-pel
        // search in the mv stack (except last ref_mv_idx).
        if (mbmi->ref_mv_idx != MAX_REF_MV_SEARCH - 1) {
          assert(args->start_mv_cnt < (MAX_REF_MV_SEARCH - 1) * 2);
          args->start_mv_stack[args->start_mv_cnt] = fmv_cand->as_fullmv;
          args->ref_mv_idx_stack[args->start_mv_cnt] = mbmi->ref_mv_idx;
          args->start_mv_cnt++;
        }
      }
    }
  }

  // Hot fix for asan complaints when resize mode is on. When resize mode is on,
  // the stride of the reference frame can be different from indicated by
  // MotionVectorSearchParams::search_site_cfg. When this happens, we need to
  // readjust the stride.
  const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, mv_sf, bsize);
  const search_site_config *src_search_site_cfg =
      av1_get_search_site_config(cpi, x, search_method);

  // Further reduce the search range.
  if (search_range < INT_MAX) {
    const search_site_config *search_site_cfg =
        &src_search_site_cfg[search_method_lookup[search_method]];
    // Max step_param is search_site_cfg->num_search_steps.
    if (search_range < 1) {
      step_param = search_site_cfg->num_search_steps;
    } else {
      while (search_site_cfg->radius[search_site_cfg->num_search_steps -
                                     step_param - 1] > (search_range << 1) &&
             search_site_cfg->num_search_steps - step_param - 1 > 0)
        step_param++;
    }
  }

  int cost_list[5];
  FULLPEL_MV_STATS best_mv_stats;
  int_mv second_best_mv;
  best_mv->as_int = second_best_mv.as_int = INVALID_MV;

  // Allow more mesh searches for screen content type on the ARF.
  const int fine_search_interval = use_fine_search_interval(cpi);
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;

  switch (mbmi->motion_mode) {
    case SIMPLE_TRANSLATION: {
      // Perform a search with the top 2 candidates
      int sum_weight = 0;
      for (int m = 0; m < cand_cnt; m++) {
        int_mv smv = cand[m].fmv;
        FULLPEL_MV this_best_mv, this_second_best_mv;
        FULLPEL_MV_STATS this_mv_stats;

        if (smv.as_int == INVALID_MV) continue;

        av1_make_default_fullpel_ms_params(
            &full_ms_params, cpi, x, bsize, &ref_mv, smv.as_fullmv,
            src_search_site_cfg, search_method, fine_search_interval);

        const int thissme =
            av1_full_pixel_search(smv.as_fullmv, &full_ms_params, step_param,
                                  cond_cost_list(cpi, cost_list), &this_best_mv,
                                  &this_mv_stats, &this_second_best_mv);

        if (thissme < bestsme) {
          bestsme = thissme;
          best_mv->as_fullmv = this_best_mv;
          best_mv_stats = this_mv_stats;
          second_best_mv.as_fullmv = this_second_best_mv;
        }

        sum_weight += cand[m].weight;
        if (4 * sum_weight > 3 * total_weight) break;
      }
    } break;
    case OBMC_CAUSAL:
      av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize,
                                         &ref_mv, start_mv, src_search_site_cfg,
                                         search_method, fine_search_interval);

      bestsme = av1_obmc_full_pixel_search(start_mv, &full_ms_params,
                                           step_param, &best_mv->as_fullmv);
      break;
    default: assert(0 && "Invalid motion mode!\n");
  }
  if (best_mv->as_int == INVALID_MV) return;

  if (scaled_ref_frame) {
    // Swap back the original buffers for subpel motion search.
    for (int i = 0; i < num_planes; i++) {
      xd->plane[i].pre[ref_idx] = backup_yv12[i];
    }
  }

  // Terminate search with the current ref_idx based on fullpel mv, rate cost,
  // and other know cost.
  if (cpi->sf.inter_sf.skip_newmv_in_drl >= 2 &&
      mbmi->motion_mode == SIMPLE_TRANSLATION &&
      best_mv->as_int != INVALID_MV) {
    int_mv this_mv;
    this_mv.as_mv = get_mv_from_fullmv(&best_mv->as_fullmv);
    const int ref_mv_idx = mbmi->ref_mv_idx;
    const int this_mv_rate =
        av1_mv_bit_cost(&this_mv.as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                        mv_costs->mv_cost_stack, MV_COST_WEIGHT);
    mode_info[ref_mv_idx].full_search_mv.as_int = this_mv.as_int;
    mode_info[ref_mv_idx].full_mv_rate = this_mv_rate;
    mode_info[ref_mv_idx].full_mv_bestsme = bestsme;

    for (int prev_ref_idx = 0; prev_ref_idx < ref_mv_idx; ++prev_ref_idx) {
      // Check if the motion search result same as previous results
      if (this_mv.as_int == mode_info[prev_ref_idx].full_search_mv.as_int) {
        // Compare the rate cost
        const int prev_rate_cost = mode_info[prev_ref_idx].full_mv_rate +
                                   mode_info[prev_ref_idx].drl_cost;
        const int this_rate_cost =
            this_mv_rate + mode_info[ref_mv_idx].drl_cost;

        if (prev_rate_cost <= this_rate_cost) {
          // If the current rate_cost is worse than the previous rate_cost, then
          // we terminate the search. Since av1_single_motion_search is only
          // called by handle_new_mv in SIMPLE_TRANSLATION mode, we set the
          // best_mv to INVALID mv to signal that we wish to terminate search
          // for the current mode.
          best_mv->as_int = INVALID_MV;
          return;
        }
      }

      // Terminate the evaluation of current ref_mv_idx based on bestsme and
      // drl_cost.
      const int psme = mode_info[prev_ref_idx].full_mv_bestsme;
      if (psme == INT_MAX) continue;
      const int thr =
          cpi->sf.inter_sf.skip_newmv_in_drl == 3 ? (psme + (psme >> 2)) : psme;
      if (cpi->sf.inter_sf.skip_newmv_in_drl >= 3 &&
          mode_info[ref_mv_idx].full_mv_bestsme > thr &&
          mode_info[prev_ref_idx].drl_cost < mode_info[ref_mv_idx].drl_cost) {
        best_mv->as_int = INVALID_MV;
        return;
      }
    }
  }

  if (cpi->common.features.cur_frame_force_integer_mv) {
    convert_fullmv_to_mv(best_mv);
  }

  const int use_fractional_mv =
      bestsme < INT_MAX && cpi->common.features.cur_frame_force_integer_mv == 0;
  int best_mv_rate = 0;
  int mv_rate_calculated = 0;
  if (use_fractional_mv) {
    int_mv fractional_ms_list[3];
    av1_set_fractional_mv(fractional_ms_list);
    int dis; /* TODO: use dis in distortion calculation later. */

    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv,
                                      cost_list);
    MV subpel_start_mv = get_mv_from_fullmv(&best_mv->as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));

    switch (mbmi->motion_mode) {
      case SIMPLE_TRANSLATION:
        if (mv_sf->use_accurate_subpel_search) {
          const int try_second = second_best_mv.as_int != INVALID_MV &&
                                 second_best_mv.as_int != best_mv->as_int &&
                                 (mv_sf->disable_second_mv <= 1);
          const int best_mv_var = mv_search_params->find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, &best_mv_stats,
              &best_mv->as_mv, &dis, &x->pred_sse[ref], fractional_ms_list);

          if (try_second) {
            struct macroblockd_plane *p = xd->plane;
            const BUFFER_SET orig_dst = {
              { p[0].dst.buf, p[1].dst.buf, p[2].dst.buf },
              { p[0].dst.stride, p[1].dst.stride, p[2].dst.stride },
            };
            int64_t rd = INT64_MAX;
            if (!mv_sf->disable_second_mv) {
              // Calculate actual rd cost.
              mbmi->mv[0].as_mv = best_mv->as_mv;
              av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, &orig_dst,
                                            bsize, 0, 0);
              av1_subtract_plane(x, bsize, 0);
              RD_STATS this_rd_stats;
              av1_init_rd_stats(&this_rd_stats);
              av1_estimate_txfm_yrd(cpi, x, &this_rd_stats, INT64_MAX, bsize,
                                    max_txsize_rect_lookup[bsize]);
              int this_mv_rate = av1_mv_bit_cost(
                  &best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                  mv_costs->mv_cost_stack, MV_COST_WEIGHT);
              rd = RDCOST(x->rdmult, this_mv_rate + this_rd_stats.rate,
                          this_rd_stats.dist);
            }

            MV this_best_mv;
            subpel_start_mv = get_mv_from_fullmv(&second_best_mv.as_fullmv);
            if (av1_is_subpelmv_in_range(&ms_params.mv_limits,
                                         subpel_start_mv)) {
              unsigned int sse;
              const int this_var = mv_search_params->find_fractional_mv_step(
                  xd, cm, &ms_params, subpel_start_mv, NULL, &this_best_mv,
                  &dis, &sse, fractional_ms_list);

              if (!mv_sf->disable_second_mv) {
                // If cpi->sf.mv_sf.disable_second_mv is 0, use actual rd cost
                // to choose the better MV.
                mbmi->mv[0].as_mv = this_best_mv;
                av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, &orig_dst,
                                              bsize, 0, 0);
                av1_subtract_plane(x, bsize, 0);
                RD_STATS tmp_rd_stats;
                av1_init_rd_stats(&tmp_rd_stats);
                av1_estimate_txfm_yrd(cpi, x, &tmp_rd_stats, INT64_MAX, bsize,
                                      max_txsize_rect_lookup[bsize]);
                int tmp_mv_rate = av1_mv_bit_cost(
                    &this_best_mv, &ref_mv, mv_costs->nmv_joint_cost,
                    mv_costs->mv_cost_stack, MV_COST_WEIGHT);
                int64_t tmp_rd =
                    RDCOST(x->rdmult, tmp_rd_stats.rate + tmp_mv_rate,
                           tmp_rd_stats.dist);
                if (tmp_rd < rd) {
                  best_mv->as_mv = this_best_mv;
                  x->pred_sse[ref] = sse;
                }
              } else {
                // If cpi->sf.mv_sf.disable_second_mv = 1, use var to decide the
                // best MV.
                if (this_var < best_mv_var) {
                  best_mv->as_mv = this_best_mv;
                  x->pred_sse[ref] = sse;
                }
              }
            }
          }
        } else {
          mv_search_params->find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, &best_mv_stats,
              &best_mv->as_mv, &dis, &x->pred_sse[ref], NULL);
        }
        break;
      case OBMC_CAUSAL:
        av1_find_best_obmc_sub_pixel_tree_up(
            xd, cm, &ms_params, subpel_start_mv, NULL, &best_mv->as_mv, &dis,
            &x->pred_sse[ref], NULL);
        break;
      default: assert(0 && "Invalid motion mode!\n");
    }

    // Terminate search with the current ref_idx based on subpel mv and rate
    // cost.
    if (cpi->sf.inter_sf.skip_newmv_in_drl >= 1 && args != NULL &&
        mbmi->motion_mode == SIMPLE_TRANSLATION &&
        best_mv->as_int != INVALID_MV) {
      const int ref_mv_idx = mbmi->ref_mv_idx;
      best_mv_rate =
          av1_mv_bit_cost(&best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                          mv_costs->mv_cost_stack, MV_COST_WEIGHT);
      mv_rate_calculated = 1;

      for (int prev_ref_idx = 0; prev_ref_idx < ref_mv_idx; ++prev_ref_idx) {
        if (!args->single_newmv_valid[prev_ref_idx][ref]) continue;
        // Check if the motion vectors are the same.
        if (best_mv->as_int == args->single_newmv[prev_ref_idx][ref].as_int) {
          // Skip this evaluation if the previous one is skipped.
          if (mode_info[prev_ref_idx].skip) {
            mode_info[ref_mv_idx].skip = 1;
            break;
          }
          // Compare the rate cost that we current know.
          const int prev_rate_cost =
              args->single_newmv_rate[prev_ref_idx][ref] +
              mode_info[prev_ref_idx].drl_cost;
          const int this_rate_cost =
              best_mv_rate + mode_info[ref_mv_idx].drl_cost;

          if (prev_rate_cost <= this_rate_cost) {
            // If the current rate_cost is worse than the previous rate_cost,
            // then we terminate the search for this ref_mv_idx.
            mode_info[ref_mv_idx].skip = 1;
            break;
          }
        }
      }
    }
  }

  if (mv_rate_calculated) {
    *rate_mv = best_mv_rate;
  } else {
    *rate_mv =
        av1_mv_bit_cost(&best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                        mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  }
}